

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

optional<bool> __thiscall
wallet::CWallet::IsInternalScriptPubKeyMan(CWallet *this,ScriptPubKeyMan *spk_man)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  runtime_error *this_00;
  element_type *peVar5;
  undefined4 extraout_var;
  allocator<char> *in_RSI;
  long in_FS_OFFSET;
  optional<OutputType> *type;
  DescriptorScriptPubKeyMan *desc_spk_man;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock68;
  CWallet *in_stack_fffffffffffffdc8;
  DescriptorScriptPubKeyMan *in_stack_fffffffffffffdd0;
  undefined6 in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffdde;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  undefined1 internal;
  undefined8 in_stack_fffffffffffffde8;
  CWallet *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  CWallet *in_stack_fffffffffffffe48;
  _Optional_payload_base<bool> local_182;
  OutputType *local_180;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_8;
  OutputType *type_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsLegacy(in_stack_fffffffffffffdc8);
  if (bVar1) {
    std::optional<bool>::optional((optional<bool> *)&local_182);
  }
  else {
    this_01 = &local_38;
    GetActiveScriptPubKeyMans(in_stack_fffffffffffffe48);
    sVar4 = std::
            set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
            ::count((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                     *)CONCAT26(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8),
                    (key_type *)in_stack_fffffffffffffdd0);
    bVar2 = sVar4 != 0 ^ 0xff;
    std::
    set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
    ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
            *)in_stack_fffffffffffffdc8);
    if ((bVar2 & 1) == 0) {
      if (in_RSI == (allocator<char> *)0x0) {
        mutexIn = (AnnotatedMixin<std::recursive_mutex> *)0x0;
      }
      else {
        mutexIn = (AnnotatedMixin<std::recursive_mutex> *)
                  __dynamic_cast(in_RSI,&ScriptPubKeyMan::typeinfo,
                                 &DescriptorScriptPubKeyMan::typeinfo,0);
      }
      if (mutexIn == (AnnotatedMixin<std::recursive_mutex> *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffe10),in_RSI);
        std::operator+(in_stack_fffffffffffffde0,
                       (char *)CONCAT26(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8));
        std::runtime_error::runtime_error(this_00,local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0170242b;
      }
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffdc8);
      internal = (undefined1)((ulong)in_stack_fffffffffffffde0 >> 0x38);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RSI,mutexIn,
                 in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0,
                 (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffde8 >> 0x18,0));
      DescriptorScriptPubKeyMan::GetWalletDescriptor(in_stack_fffffffffffffdd0);
      peVar5 = std::__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffdc8);
      iVar3 = (*peVar5->_vptr_Descriptor[0xb])();
      type_00 = (OutputType *)CONCAT44(extraout_var,iVar3);
      local_180 = type_00;
      WalletDescriptor::~WalletDescriptor((WalletDescriptor *)in_stack_fffffffffffffdc8);
      bVar1 = std::optional<OutputType>::has_value
                        ((optional<OutputType> *)in_stack_fffffffffffffdc8);
      if (!bVar1) {
        __assert_fail("type.has_value()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0xf3d,
                      "std::optional<bool> wallet::CWallet::IsInternalScriptPubKeyMan(ScriptPubKeyMan *) const"
                     );
      }
      std::optional<OutputType>::operator*((optional<OutputType> *)in_stack_fffffffffffffdc8);
      GetScriptPubKeyMan(in_stack_fffffffffffffdf0,type_00,(bool)internal);
      std::optional<bool>::optional<bool,_true>
                ((optional<bool> *)CONCAT26(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8),
                 (bool *)in_stack_fffffffffffffdd0);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffdc8);
    }
    else {
      std::optional<bool>::optional((optional<bool> *)&local_182);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)local_182;
  }
LAB_0170242b:
  __stack_chk_fail();
}

Assistant:

std::optional<bool> CWallet::IsInternalScriptPubKeyMan(ScriptPubKeyMan* spk_man) const
{
    // Legacy script pubkey man can't be either external or internal
    if (IsLegacy()) {
        return std::nullopt;
    }

    // only active ScriptPubKeyMan can be internal
    if (!GetActiveScriptPubKeyMans().count(spk_man)) {
        return std::nullopt;
    }

    const auto desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man);
    if (!desc_spk_man) {
        throw std::runtime_error(std::string(__func__) + ": unexpected ScriptPubKeyMan type.");
    }

    LOCK(desc_spk_man->cs_desc_man);
    const auto& type = desc_spk_man->GetWalletDescriptor().descriptor->GetOutputType();
    assert(type.has_value());

    return GetScriptPubKeyMan(*type, /* internal= */ true) == desc_spk_man;
}